

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

Vec4 __thiscall
tcu::sampleNearest1D
          (tcu *this,ConstPixelBufferAccess *access,Sampler *sampler,float u,IVec2 *offset)

{
  int iVar1;
  deInt32 dVar2;
  int iVar3;
  deBool dVar4;
  TextureFormat *format;
  undefined1 auVar6 [12];
  undefined8 uVar7;
  Vec4 VVar5;
  int i;
  int x;
  int width;
  IVec2 *offset_local;
  float u_local;
  Sampler *sampler_local;
  ConstPixelBufferAccess *access_local;
  
  iVar1 = ConstPixelBufferAccess::getWidth(access);
  dVar2 = deFloorFloatToInt32(u);
  iVar3 = Vector<int,_2>::x(offset);
  if ((sampler->wrapS == CLAMP_TO_BORDER) &&
     (dVar4 = deInBounds32(dVar2 + iVar3,0,iVar1), dVar4 == 0)) {
    format = ConstPixelBufferAccess::getFormat(access);
    VVar5 = lookupBorder(this,format,sampler);
    VVar5.m_data[0] = VVar5.m_data[0];
    auVar6._4_4_ = VVar5.m_data[1];
    register0x00001240 = VVar5.m_data[2];
    register0x00001244 = VVar5.m_data[3];
    return (Vec4)VVar5.m_data;
  }
  iVar1 = wrap(sampler->wrapS,dVar2 + iVar3,iVar1);
  iVar3 = Vector<int,_2>::y(offset);
  VVar5 = lookup(this,access,iVar1,iVar3,0);
  return (Vec4)VVar5.m_data;
}

Assistant:

static Vec4 sampleNearest1D (const ConstPixelBufferAccess& access, const Sampler& sampler, float u, const IVec2& offset)
{
	int width	= access.getWidth();

	int x = deFloorFloatToInt32(u)+offset.x();

	// Check for CLAMP_TO_BORDER.
	if (sampler.wrapS == Sampler::CLAMP_TO_BORDER && !deInBounds32(x, 0, width))
		return lookupBorder(access.getFormat(), sampler);

	int i = wrap(sampler.wrapS, x, width);

	return lookup(access, i, offset.y(), 0);
}